

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O3

int __thiscall
TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>::ClassId
          (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  string sStack_1fb38;
  TPZFrontSym<double> TStack_1fb18;
  TPZStackEqnStorage<double> TStack_1f9f0;
  
  sStack_1fb38._M_dataplus._M_p = (pointer)&sStack_1fb38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_1fb38,"TPZFrontMatrix","");
  uVar1 = Hash(&sStack_1fb38);
  iVar2 = TPZAbstractFrontMatrix<double>::ClassId(&this->super_TPZAbstractFrontMatrix<double>);
  TPZStackEqnStorage<double>::TPZStackEqnStorage(&TStack_1f9f0);
  iVar3 = TPZStackEqnStorage<double>::ClassId(&TStack_1f9f0);
  TPZFrontSym<double>::TPZFrontSym(&TStack_1fb18);
  iVar4 = TPZFrontSym<double>::ClassId(&TStack_1fb18);
  TPZFrontSym<double>::~TPZFrontSym(&TStack_1fb18);
  TPZStackEqnStorage<double>::~TPZStackEqnStorage(&TStack_1f9f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1fb38._M_dataplus._M_p != &sStack_1fb38.field_2) {
    operator_delete(sStack_1fb38._M_dataplus._M_p,sStack_1fb38.field_2._M_allocated_capacity + 1);
  }
  return iVar4 << 3 ^ iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::ClassId() const{
    return Hash("TPZFrontMatrix") ^ TPZAbstractFrontMatrix<TVar>::ClassId() << 1 ^ store().ClassId() << 2 ^ front().ClassId() << 3;
}